

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::fastpackwithoutmask_8(uint32_t *in,uint32_t *out,uint32_t bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint32_t *puVar4;
  logic_error *this;
  
  switch(bit) {
  case 0:
    goto switchD_00178ff5_caseD_0;
  case 1:
    puVar4 = __fastpackwithoutmask1_8(in,out);
    return puVar4;
  case 2:
    puVar4 = __fastpackwithoutmask2_8(in,out);
    return puVar4;
  case 3:
    puVar4 = __fastpackwithoutmask3_8(in,out);
    return puVar4;
  case 4:
    puVar4 = __fastpackwithoutmask4_8(in,out);
    return puVar4;
  case 5:
    puVar4 = __fastpackwithoutmask5_8(in,out);
    return puVar4;
  case 6:
    puVar4 = __fastpackwithoutmask6_8(in,out);
    return puVar4;
  case 7:
    puVar4 = __fastpackwithoutmask7_8(in,out);
    return puVar4;
  case 8:
    puVar4 = __fastpackwithoutmask8_8(in,out);
    return puVar4;
  case 9:
    puVar4 = __fastpackwithoutmask9_8(in,out);
    return puVar4;
  case 10:
    puVar4 = __fastpackwithoutmask10_8(in,out);
    return puVar4;
  case 0xb:
    puVar4 = __fastpackwithoutmask11_8(in,out);
    return puVar4;
  case 0xc:
    puVar4 = __fastpackwithoutmask12_8(in,out);
    return puVar4;
  case 0xd:
    puVar4 = __fastpackwithoutmask13_8(in,out);
    return puVar4;
  case 0xe:
    puVar4 = __fastpackwithoutmask14_8(in,out);
    return puVar4;
  case 0xf:
    puVar4 = __fastpackwithoutmask15_8(in,out);
    return puVar4;
  case 0x10:
    puVar4 = __fastpackwithoutmask16_8(in,out);
    return puVar4;
  case 0x11:
    puVar4 = __fastpackwithoutmask17_8(in,out);
    return puVar4;
  case 0x12:
    puVar4 = __fastpackwithoutmask18_8(in,out);
    return puVar4;
  case 0x13:
    puVar4 = __fastpackwithoutmask19_8(in,out);
    return puVar4;
  case 0x14:
    puVar4 = __fastpackwithoutmask20_8(in,out);
    return puVar4;
  case 0x15:
    puVar4 = __fastpackwithoutmask21_8(in,out);
    return puVar4;
  case 0x16:
    puVar4 = __fastpackwithoutmask22_8(in,out);
    return puVar4;
  case 0x17:
    puVar4 = __fastpackwithoutmask23_8(in,out);
    return puVar4;
  case 0x18:
    puVar4 = __fastpackwithoutmask24_8(in,out);
    return puVar4;
  case 0x19:
    puVar4 = __fastpackwithoutmask25_8(in,out);
    return puVar4;
  case 0x1a:
    puVar4 = __fastpackwithoutmask26_8(in,out);
    return puVar4;
  case 0x1b:
    puVar4 = __fastpackwithoutmask27_8(in,out);
    return puVar4;
  case 0x1c:
    puVar4 = __fastpackwithoutmask28_8(in,out);
    return puVar4;
  case 0x1d:
    puVar4 = __fastpackwithoutmask29_8(in,out);
    return puVar4;
  case 0x1e:
    puVar4 = __fastpackwithoutmask30_8(in,out);
    return puVar4;
  case 0x1f:
    puVar4 = __fastpackwithoutmask31_8(in,out);
    return puVar4;
  case 0x20:
    uVar1 = *(undefined8 *)(in + 2);
    uVar2 = *(undefined8 *)(in + 4);
    uVar3 = *(undefined8 *)(in + 6);
    *(undefined8 *)out = *(undefined8 *)in;
    *(undefined8 *)(out + 2) = uVar1;
    *(undefined8 *)(out + 4) = uVar2;
    *(undefined8 *)(out + 6) = uVar3;
    out = out + 8;
switchD_00178ff5_caseD_0:
    return out;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

uint32_t *fastpackwithoutmask_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out,
                                const uint32_t bit) {
  switch (bit) {
  case 0:
    return nullpacker(in, out);

  case 1:
    return __fastpackwithoutmask1_8(in, out);

  case 2:
    return __fastpackwithoutmask2_8(in, out);

  case 3:
    return __fastpackwithoutmask3_8(in, out);

  case 4:
    return __fastpackwithoutmask4_8(in, out);

  case 5:
    return __fastpackwithoutmask5_8(in, out);

  case 6:
    return __fastpackwithoutmask6_8(in, out);

  case 7:
    return __fastpackwithoutmask7_8(in, out);

  case 8:
    return __fastpackwithoutmask8_8(in, out);

  case 9:
    return __fastpackwithoutmask9_8(in, out);

  case 10:
    return __fastpackwithoutmask10_8(in, out);

  case 11:
    return __fastpackwithoutmask11_8(in, out);

  case 12:
    return __fastpackwithoutmask12_8(in, out);

  case 13:
    return __fastpackwithoutmask13_8(in, out);

  case 14:
    return __fastpackwithoutmask14_8(in, out);

  case 15:
    return __fastpackwithoutmask15_8(in, out);

  case 16:
    return __fastpackwithoutmask16_8(in, out);

  case 17:
    return __fastpackwithoutmask17_8(in, out);

  case 18:
    return __fastpackwithoutmask18_8(in, out);

  case 19:
    return __fastpackwithoutmask19_8(in, out);

  case 20:
    return __fastpackwithoutmask20_8(in, out);

  case 21:
    return __fastpackwithoutmask21_8(in, out);

  case 22:
    return __fastpackwithoutmask22_8(in, out);

  case 23:
    return __fastpackwithoutmask23_8(in, out);

  case 24:
    return __fastpackwithoutmask24_8(in, out);

  case 25:
    return __fastpackwithoutmask25_8(in, out);

  case 26:
    return __fastpackwithoutmask26_8(in, out);

  case 27:
    return __fastpackwithoutmask27_8(in, out);

  case 28:
    return __fastpackwithoutmask28_8(in, out);

  case 29:
    return __fastpackwithoutmask29_8(in, out);

  case 30:
    return __fastpackwithoutmask30_8(in, out);

  case 31:
    return __fastpackwithoutmask31_8(in, out);

  case 32:
    return __fastpackwithoutmask32_8(in, out);

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}